

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

_Bool amqpvalue_are_equal(AMQP_VALUE value1,AMQP_VALUE value2)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  LOGGER_LOG p_Var4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  
  if (value1 == (AMQP_VALUE)0x0 && value2 == (AMQP_VALUE)0x0) {
    p_Var4 = xlogging_get_log_function();
    uVar5 = 1;
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_are_equal",0x7f3,1,"Bad arguments: value1 = %p, value2 = %p",
                (undefined1  [16])0x0);
    }
    goto LAB_00105fc1;
  }
  if (((value1 != value2) && (value1 == (AMQP_VALUE)0x0 || value2 == (AMQP_VALUE)0x0)) ||
     (value1->type != value2->type)) {
switchD_00105f29_default:
    uVar5 = 0;
    goto LAB_00105fc1;
  }
  switch(value1->type) {
  case AMQP_TYPE_NULL:
    uVar5 = 1;
    goto LAB_00105fc1;
  case AMQP_TYPE_BOOL:
  case AMQP_TYPE_UBYTE:
  case AMQP_TYPE_BYTE:
    bVar7 = (value1->value).ubyte_value == (value2->value).ubyte_value;
    break;
  case AMQP_TYPE_USHORT:
  case AMQP_TYPE_SHORT:
    bVar7 = (value1->value).ushort_value == (value2->value).ushort_value;
    break;
  case AMQP_TYPE_UINT:
  case AMQP_TYPE_INT:
  case AMQP_TYPE_CHAR:
    bVar7 = (value1->value).uint_value == (value2->value).uint_value;
    break;
  case AMQP_TYPE_ULONG:
  case AMQP_TYPE_LONG:
  case AMQP_TYPE_TIMESTAMP:
    bVar7 = (value1->value).described_value.descriptor == (value2->value).described_value.descriptor
    ;
    break;
  case AMQP_TYPE_FLOAT:
    bVar7 = (value2->value).float_value == (value1->value).float_value;
    goto LAB_00105fe5;
  case AMQP_TYPE_DOUBLE:
    bVar7 = (value2->value).double_value == (value1->value).double_value;
LAB_00105fe5:
    uVar5 = (ulong)(-(uint)bVar7 & 1);
    goto LAB_00105fc1;
  case AMQP_TYPE_UUID:
    auVar8[0] = -((value2->value).ubyte_value == (value1->value).ubyte_value);
    auVar8[1] = -((value2->value).uuid_value[1] == (value1->value).uuid_value[1]);
    auVar8[2] = -((value2->value).uuid_value[2] == (value1->value).uuid_value[2]);
    auVar8[3] = -((value2->value).uuid_value[3] == (value1->value).uuid_value[3]);
    auVar8[4] = -((value2->value).uuid_value[4] == (value1->value).uuid_value[4]);
    auVar8[5] = -((value2->value).uuid_value[5] == (value1->value).uuid_value[5]);
    auVar8[6] = -((value2->value).uuid_value[6] == (value1->value).uuid_value[6]);
    auVar8[7] = -((value2->value).uuid_value[7] == (value1->value).uuid_value[7]);
    auVar8[8] = -((value2->value).uuid_value[8] == (value1->value).uuid_value[8]);
    auVar8[9] = -((value2->value).uuid_value[9] == (value1->value).uuid_value[9]);
    auVar8[10] = -((value2->value).uuid_value[10] == (value1->value).uuid_value[10]);
    auVar8[0xb] = -((value2->value).uuid_value[0xb] == (value1->value).uuid_value[0xb]);
    auVar8[0xc] = -((value2->value).uuid_value[0xc] == (value1->value).uuid_value[0xc]);
    auVar8[0xd] = -((value2->value).uuid_value[0xd] == (value1->value).uuid_value[0xd]);
    auVar8[0xe] = -((value2->value).uuid_value[0xe] == (value1->value).uuid_value[0xe]);
    auVar8[0xf] = -((value2->value).uuid_value[0xf] == (value1->value).uuid_value[0xf]);
    bVar7 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar8[0xf] >> 7) << 0xf) == 0xffff;
    break;
  case AMQP_TYPE_BINARY:
    uVar1 = (value1->value).binary_value.length;
    if (uVar1 != (value2->value).binary_value.length) goto switchD_00105f29_default;
    iVar3 = bcmp((value1->value).binary_value.bytes,(value2->value).binary_value.bytes,(ulong)uVar1)
    ;
    goto LAB_00105f6e;
  case AMQP_TYPE_STRING:
  case AMQP_TYPE_SYMBOL:
    iVar3 = strcmp((char *)(value1->value).described_value.descriptor,
                   (char *)(value2->value).described_value.descriptor);
LAB_00105f6e:
    bVar7 = iVar3 == 0;
    break;
  case AMQP_TYPE_LIST:
    uVar5 = 0;
    if ((value1->value).binary_value.length != (value2->value).binary_value.length)
    goto LAB_00105fc1;
    if ((value1->value).binary_value.length != 0) {
      uVar5 = 0;
      do {
        _Var2 = amqpvalue_are_equal(*(AMQP_VALUE *)
                                     (&((value1->value).described_value.descriptor)->type +
                                     uVar5 * 2),
                                    *(AMQP_VALUE *)
                                     (&((value2->value).described_value.descriptor)->type +
                                     uVar5 * 2));
        if (!_Var2) break;
        uVar5 = uVar5 + 1;
      } while (uVar5 < (value1->value).binary_value.length);
    }
    goto LAB_001060d1;
  case AMQP_TYPE_MAP:
    uVar5 = 0;
    if ((value1->value).binary_value.length != (value2->value).binary_value.length)
    goto LAB_00105fc1;
    if ((value1->value).binary_value.length != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        _Var2 = amqpvalue_are_equal(*(AMQP_VALUE *)
                                     ((long)&((value1->value).described_value.descriptor)->type +
                                     lVar6),*(AMQP_VALUE *)
                                             ((long)&((value2->value).described_value.descriptor)->
                                                     type + lVar6));
        if ((!_Var2) ||
           (_Var2 = amqpvalue_are_equal(*(AMQP_VALUE *)
                                         ((long)&((value1->value).described_value.descriptor)->value
                                         + lVar6),
                                        *(AMQP_VALUE *)
                                         ((long)&((value2->value).described_value.descriptor)->value
                                         + lVar6)), !_Var2)) break;
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x10;
      } while (uVar5 < (value1->value).binary_value.length);
    }
    goto LAB_001060d1;
  case AMQP_TYPE_ARRAY:
    uVar5 = 0;
    if ((value1->value).binary_value.length != (value2->value).binary_value.length)
    goto LAB_00105fc1;
    if ((value1->value).binary_value.length != 0) {
      uVar5 = 0;
      do {
        _Var2 = amqpvalue_are_equal(*(AMQP_VALUE *)
                                     (&((value1->value).described_value.descriptor)->type +
                                     uVar5 * 2),
                                    *(AMQP_VALUE *)
                                     (&((value2->value).described_value.descriptor)->type +
                                     uVar5 * 2));
        if (!_Var2) break;
        uVar5 = uVar5 + 1;
      } while (uVar5 < (value1->value).binary_value.length);
    }
LAB_001060d1:
    bVar7 = (uint32_t)uVar5 == (value1->value).binary_value.length;
    break;
  default:
    goto switchD_00105f29_default;
  }
  uVar5 = (ulong)bVar7;
LAB_00105fc1:
  return SUB81(uVar5,0);
}

Assistant:

bool amqpvalue_are_equal(AMQP_VALUE value1, AMQP_VALUE value2)
{
    bool result;

    /* Codes_SRS_AMQPVALUE_01_207: [If value1 and value2 are NULL, amqpvalue_are_equal shall return true.] */
    if ((value1 == NULL) &&
        (value2 == NULL))
    {
        LogError("Bad arguments: value1 = %p, value2 = %p",
            value1, value2);
        result = true;
    }
    /* Codes_SRS_AMQPVALUE_01_208: [If one of the arguments is NULL and the other is not, amqpvalue_are_equal shall return false.] */
    else if ((value1 != value2) && ((value1 == NULL) || (value2 == NULL)))
    {
        result = false;
    }
    else
    {
        AMQP_VALUE_DATA* value1_data = (AMQP_VALUE_DATA*)value1;
        AMQP_VALUE_DATA* value2_data = (AMQP_VALUE_DATA*)value2;

        /* Codes_SRS_AMQPVALUE_01_209: [If the types for value1 and value2 are different amqpvalue_are_equal shall return false.] */
#if _MSC_VER
#pragma warning(suppress: 28182) /* The compiler states that value2_data can be NULL, but it cannot. And there are tests for it. */
#endif
        if (value1_data->type != value2_data->type)
        {
            result = false;
        }
        else
        {
            switch (value1_data->type)
            {
            default:
                result = false;
                break;

            case AMQP_TYPE_NULL:
                /* Codes_SRS_AMQPVALUE_01_210: [- null: always equal.] */
                result = true;
                break;

            case AMQP_TYPE_BOOL:
                /* Codes_SRS_AMQPVALUE_01_211: [- boolean: compare the bool content.] */
                result = (value1_data->value.bool_value == value2_data->value.bool_value);
                break;

            case AMQP_TYPE_UBYTE:
                /* Codes_SRS_AMQPVALUE_01_212: [- ubyte: compare the unsigned char content.] */
                result = (value1_data->value.ubyte_value == value2_data->value.ubyte_value);
                break;

            case AMQP_TYPE_USHORT:
                /* Codes_SRS_AMQPVALUE_01_213: [- ushort: compare the uint16_t content.] */
                result = (value1_data->value.ushort_value == value2_data->value.ushort_value);
                break;

            case AMQP_TYPE_UINT:
                /* Codes_SRS_AMQPVALUE_01_214: [- uint: compare the uint32_t content.] */
                result = (value1_data->value.uint_value == value2_data->value.uint_value);
                break;

            case AMQP_TYPE_ULONG:
                /* Codes_SRS_AMQPVALUE_01_215: [- ulong: compare the uint64_t content.] */
                result = (value1_data->value.ulong_value == value2_data->value.ulong_value);
                break;

            case AMQP_TYPE_BYTE:
                /* Codes_SRS_AMQPVALUE_01_216: [- byte: compare the char content.] */
                result = (value1_data->value.byte_value == value2_data->value.byte_value);
                break;

            case AMQP_TYPE_SHORT:
                /* Codes_SRS_AMQPVALUE_01_217: [- short: compare the int16_t content.] */
                result = (value1_data->value.short_value == value2_data->value.short_value);
                break;

            case AMQP_TYPE_INT:
                /* Codes_SRS_AMQPVALUE_01_218: [- int: compare the int32_t content.] */
                result = (value1_data->value.int_value == value2_data->value.int_value);
                break;

            case AMQP_TYPE_LONG:
                /* Codes_SRS_AMQPVALUE_01_219: [- long: compare the int64_t content.] */
                result = (value1_data->value.long_value == value2_data->value.long_value);
                break;

            case AMQP_TYPE_FLOAT:
                /* Codes_SRS_AMQPVALUE_01_224: [- float: compare the float content.] */
                result = (value1_data->value.float_value == value2_data->value.float_value);
                break;

            case AMQP_TYPE_DOUBLE:
                /* Codes_SRS_AMQPVALUE_01_225: [- double: compare the double content.] */
                result = (value1_data->value.double_value == value2_data->value.double_value);
                break;

            case AMQP_TYPE_CHAR:
                /* Codes_SRS_AMQPVALUE_01_226: [- char: compare the UNICODE character.] */
                result = (value1_data->value.char_value == value2_data->value.char_value);
                break;

            case AMQP_TYPE_TIMESTAMP:
                /* Codes_SRS_AMQPVALUE_01_227: [- timestamp: compare the underlying 64 bit integer.] */
                result = (value1_data->value.timestamp_value == value2_data->value.timestamp_value);
                break;

            case AMQP_TYPE_UUID:
                /* Codes_SRS_AMQPVALUE_01_228: [- uuid: compare all uuid bytes.] */
                result = (memcmp(value1_data->value.uuid_value, value2_data->value.uuid_value, sizeof(value1_data->value.uuid_value)) == 0);
                break;

            case AMQP_TYPE_BINARY:
                /* Codes_SRS_AMQPVALUE_01_229: [- binary: compare all binary bytes.] */
                result = (value1_data->value.binary_value.length == value2_data->value.binary_value.length) &&
                    (memcmp(value1_data->value.binary_value.bytes, value2_data->value.binary_value.bytes, value1_data->value.binary_value.length) == 0);
                break;

            case AMQP_TYPE_STRING:
                /* Codes_SRS_AMQPVALUE_01_230: [- string: compare all string characters.] */
                result = (strcmp(value1_data->value.string_value.chars, value2_data->value.string_value.chars) == 0);
                break;

            case AMQP_TYPE_SYMBOL:
                /* Codes_SRS_AMQPVALUE_01_263: [- symbol: compare all symbol characters.] */
                result = (strcmp(value1_data->value.symbol_value.chars, value2_data->value.symbol_value.chars) == 0);
                break;

            case AMQP_TYPE_LIST:
            {
                /* Codes_SRS_AMQPVALUE_01_231: [- list: compare list item count and each element.] */
                if (value1_data->value.list_value.count != value2_data->value.list_value.count)
                {
                    result = false;
                }
                else
                {
                    uint32_t i;

                    for (i = 0; i < value1_data->value.list_value.count; i++)
                    {
                        /* Codes_SRS_AMQPVALUE_01_232: [Nesting shall be considered in comparison.] */
                        if (!amqpvalue_are_equal(value1_data->value.list_value.items[i], value2_data->value.list_value.items[i]))
                        {
                            break;
                        }
                    }

                    result = (i == value1_data->value.list_value.count);
                }

                break;
            }
            case AMQP_TYPE_ARRAY:
            {
                /* Codes_SRS_AMQPVALUE_01_427: [- array: compare array item count and each element. ] */
                if (value1_data->value.array_value.count != value2_data->value.array_value.count)
                {
                    result = false;
                }
                else
                {
                    uint32_t i;

                    for (i = 0; i < value1_data->value.array_value.count; i++)
                    {
                        /* Codes_SRS_AMQPVALUE_01_428: [ Nesting shall be considered in comparison. ] */
                        if (!amqpvalue_are_equal(value1_data->value.array_value.items[i], value2_data->value.array_value.items[i]))
                        {
                            break;
                        }
                    }

                    result = (i == value1_data->value.array_value.count);
                }

                break;
            }
            case AMQP_TYPE_MAP:
            {
                /* Codes_SRS_AMQPVALUE_01_233: [- map: compare map pair count and each key/value pair.] */
                if (value1_data->value.map_value.pair_count != value2_data->value.map_value.pair_count)
                {
                    result = false;
                }
                else
                {
                    uint32_t i;

                    /* Codes_SRS_AMQPVALUE_01_126: [Unless known to be otherwise, maps MUST be considered to be ordered, that is, the order of the key-value pairs is semantically important and two maps which are different only in the order in which their key-value pairs are encoded are not equal.] */
                    for (i = 0; i < value1_data->value.map_value.pair_count; i++)
                    {
                        /* Codes_SRS_AMQPVALUE_01_234: [Nesting shall be considered in comparison.] */
                        if ((!amqpvalue_are_equal(value1_data->value.map_value.pairs[i].key, value2_data->value.map_value.pairs[i].key)) ||
                            (!amqpvalue_are_equal(value1_data->value.map_value.pairs[i].value, value2_data->value.map_value.pairs[i].value)))
                        {
                            break;
                        }
                    }

                    result = (i == value1_data->value.map_value.pair_count);
                }

                break;
            }
            }
        }
    }

    return result;
}